

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int flow_get_available(FLOW_HANDLE flow,uint32_t *available_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  FLOW_INSTANCE *flow_instance;
  uint32_t item_count;
  int result;
  uint32_t *available_value_local;
  FLOW_HANDLE flow_local;
  
  if (flow == (FLOW_HANDLE)0x0) {
    flow_instance._4_4_ = 0x1931;
  }
  else {
    _item_count = available_value;
    available_value_local = (uint32_t *)flow;
    iVar1 = amqpvalue_get_composite_item_count(flow->composite_value,(uint32_t *)&flow_instance);
    if (iVar1 == 0) {
      if ((uint)flow_instance < 8) {
        flow_instance._4_4_ = 0x193f;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(flow->composite_value,7);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          flow_instance._4_4_ = 0x1947;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            flow_instance._4_4_ = 0;
          }
          else {
            flow_instance._4_4_ = 0x194e;
          }
        }
      }
    }
    else {
      flow_instance._4_4_ = 0x1939;
    }
  }
  return flow_instance._4_4_;
}

Assistant:

int flow_get_available(FLOW_HANDLE flow, uint32_t* available_value)
{
    int result;

    if (flow == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow;
        if (amqpvalue_get_composite_item_count(flow_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 7)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(flow_instance->composite_value, 7);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_uint(item_value, available_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}